

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O2

void __thiscall
feintrack::SimpleLeftObjectsDetector::add_left_object_to_out_rects
          (SimpleLeftObjectsDetector *this,CLeftObjView *left_obj,types type,
          VideoHeader *videoHeader)

{
  int *piVar1;
  int iVar2;
  size_t sVar3;
  pointer pCVar4;
  pointer pCVar5;
  CLeftObjRect local_38;
  
  sVar3 = this->left_objects_count;
  this->left_objects_count = sVar3 + 1;
  pCVar4 = (this->left_obj_rects).
           super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->left_obj_rects).
                     super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) / 0x18) < sVar3 + 1)
  {
    local_38.obj_uid = left_obj->obj_uid;
    local_38.super_RECT_.left = (left_obj->rect).left;
    local_38.super_RECT_.right = (left_obj->rect).right;
    local_38.super_RECT_.top = (left_obj->rect).top;
    local_38.super_RECT_.bottom = (left_obj->rect).bottom;
    local_38.type = type;
    std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
    emplace_back<feintrack::CLeftObjRect>(&this->left_obj_rects,&local_38);
    iVar2 = videoHeader->left_padding;
    if (iVar2 != 0) {
      sVar3 = this->left_objects_count;
      pCVar5 = (this->left_obj_rects).
               super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar4 = pCVar5 + (sVar3 - 1);
      (pCVar4->super_RECT_).left = (pCVar4->super_RECT_).left + iVar2;
      piVar1 = &pCVar5[sVar3 - 1].super_RECT_.right;
      *piVar1 = *piVar1 + iVar2;
    }
    iVar2 = videoHeader->top_padding;
    if (iVar2 != 0) {
      sVar3 = this->left_objects_count;
      pCVar4 = (this->left_obj_rects).
               super__Vector_base<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar1 = &pCVar4[sVar3 - 1].super_RECT_.top;
      *piVar1 = *piVar1 + iVar2;
      piVar1 = &pCVar4[sVar3 - 1].super_RECT_.bottom;
      *piVar1 = *piVar1 + iVar2;
    }
  }
  else {
    iVar2 = videoHeader->left_padding;
    pCVar4[sVar3].super_RECT_.left = (left_obj->rect).left + iVar2;
    pCVar4[sVar3].super_RECT_.right = iVar2 + (left_obj->rect).right;
    iVar2 = videoHeader->top_padding;
    pCVar4[sVar3].super_RECT_.top = (left_obj->rect).top + iVar2;
    pCVar4[sVar3].super_RECT_.bottom = iVar2 + (left_obj->rect).bottom;
    pCVar4[sVar3].type = type;
    pCVar4[sVar3].obj_uid = left_obj->obj_uid;
  }
  return;
}

Assistant:

void SimpleLeftObjectsDetector::add_left_object_to_out_rects(
        const CLeftObjView &left_obj,
        CLeftObjRect::types type,
        const VideoHeader& videoHeader
        )
{
    // Здесь сделана попытка избежать лишних выделений памяти: массив left_obj_rects никогда не уменьшается
    // Он может только увеличивать свой размер, если на последующих кадрах выделенных объектов больше, чем на предыдущих
    if (++left_objects_count > left_obj_rects.size())
    {
        left_obj_rects.push_back(CLeftObjRect(left_obj.rect, type, left_obj.obj_uid));
        if (videoHeader.left_padding)
        {
            left_obj_rects[left_objects_count - 1].left += videoHeader.left_padding;
            left_obj_rects[left_objects_count - 1].right += videoHeader.left_padding;
        }
        if (videoHeader.top_padding)
        {
            left_obj_rects[left_objects_count - 1].top += videoHeader.top_padding;
            left_obj_rects[left_objects_count - 1].bottom += videoHeader.top_padding;
        }
    }
    else
    {
        left_obj_rects[left_objects_count - 1].left = left_obj.rect.left + videoHeader.left_padding;
        left_obj_rects[left_objects_count - 1].right = left_obj.rect.right + videoHeader.left_padding;
        left_obj_rects[left_objects_count - 1].top = left_obj.rect.top + videoHeader.top_padding;
        left_obj_rects[left_objects_count - 1].bottom = left_obj.rect.bottom + videoHeader.top_padding;
        left_obj_rects[left_objects_count - 1].type = type;
        left_obj_rects[left_objects_count - 1].obj_uid = left_obj.obj_uid;
    }
}